

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_mass_healing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_R8D;
  int refresh_num;
  int heal_num;
  CHAR_DATA *gch;
  char *in_stack_ffffffffffffffd8;
  CHAR_DATA *bch;
  undefined4 in_stack_ffffffffffffffe0;
  
  skill_lookup(in_stack_ffffffffffffffd8);
  skill_lookup(in_stack_ffffffffffffffd8);
  for (bch = in_RDX->in_room->people; bch != (CHAR_DATA *)0x0; bch = bch->next_in_room) {
    bVar1 = is_same_group(in_RDX,bch);
    if (bVar1) {
      spell_heal((int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX,
                 (void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)bch >> 0x20));
      spell_refresh((int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX,
                    (void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)bch >> 0x20));
    }
  }
  return;
}

Assistant:

void spell_mass_healing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *gch;
	int heal_num, refresh_num;

	heal_num = skill_lookup("heal");
	refresh_num = skill_lookup("refresh");

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(ch, gch))
		{
			spell_heal(heal_num, level, ch, (void *)gch, TARGET_CHAR);
			spell_refresh(refresh_num, level, ch, (void *)gch, TARGET_CHAR);
		}
	}
}